

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::AssertLoadFactor
          (KeyMapBase<unsigned_long> *this)

{
  size_type t;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  unsigned_long local_28;
  uint local_1c;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  KeyMapBase<unsigned_long> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  local_1c = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((this->super_UntypedMapBase).num_elements_);
  t = CalculateHiCutoff((ulong)(this->super_UntypedMapBase).num_buckets_);
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_18 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_int,unsigned_long>
                       (&local_1c,&local_28,"num_elements_ <= CalculateHiCutoff(num_buckets_)");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x345,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return;
}

Assistant:

void AssertLoadFactor() const {
    ABSL_DCHECK_LE(num_elements_, CalculateHiCutoff(num_buckets_));
  }